

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void trieste::logging::append<char[14]>(Log *self,char (*t) [14])

{
  runtime_error *this;
  
  if (self->print != Silent) {
    std::operator<<((ostream *)((self->strstream).data + 0x10),*t);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Log should not be printed! Use should_print()");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_active()
    {
      return print != Status::Silent;
    }